

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall higan::TcpServer::~TcpServer(TcpServer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  
  p_Var2 = (this->newconnection_callback_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->newconnection_callback_,
              (_Any_data *)&this->newconnection_callback_,__destroy_functor);
  }
  p_Var2 = (this->message_callback_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->message_callback_,(_Any_data *)&this->message_callback_,
              __destroy_functor);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>_>_>
  ::~_Rb_tree(&(this->connection_map_)._M_t);
  Acceptor::~Acceptor(&this->acceptor_);
  pcVar3 = (this->server_addr_).ip_._M_dataplus._M_p;
  paVar1 = &(this->server_addr_).ip_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->server_name_)._M_dataplus._M_p;
  paVar1 = &(this->server_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  EventLoopThreadPool::~EventLoopThreadPool(&this->thread_pool_);
  return;
}

Assistant:

TcpServer::~TcpServer()
{

}